

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O1

UINT8 Pulse_Start(void *drvObj,UINT32 deviceID,AUDIO_OPTS *options,void *audDrvParam)

{
  byte bVar1;
  uint uVar2;
  UINT8 UVar3;
  long lVar4;
  void *pvVar5;
  UINT32 UVar6;
  int iVar7;
  AUDIO_OPTS *pAVar8;
  byte bVar9;
  DRV_PULSE *drv;
  
  if (*(char *)((long)drvObj + 8) != '\0') {
    return 0xd0;
  }
  pAVar8 = &defOptions;
  if (options != (AUDIO_OPTS *)0x0) {
    pAVar8 = options;
  }
  *(void **)drvObj = audDrvParam;
  bVar9 = pAVar8->numChannels;
  *(byte *)((long)drvObj + 0x14) = bVar9;
  uVar2 = pAVar8->sampleRate;
  *(uint *)((long)drvObj + 0x10) = uVar2;
  iVar7 = (int)(((ulong)pAVar8->usecPerBuf * (ulong)uVar2 + 500000) / 1000000);
  *(int *)((long)drvObj + 0x18) = iVar7;
  bVar1 = pAVar8->numBitsPerSmpl;
  *(uint *)((long)drvObj + 0x1c) = ((uint)bVar1 * (uint)bVar9 >> 3) * iVar7;
  UVar6 = 10;
  if (pAVar8->numBuffers != 0) {
    UVar6 = pAVar8->numBuffers;
  }
  *(UINT32 *)((long)drvObj + 0x20) = UVar6;
  bVar9 = bVar1 * ' ' | (byte)(bVar1 - 8) >> 3;
  UVar3 = 0xcf;
  if (bVar9 < 4) {
    *(undefined4 *)((long)drvObj + 0xc) = *(undefined4 *)(&DAT_001736e8 + (ulong)bVar9 * 4);
    *(undefined1 *)((long)drvObj + 0x51) = 1;
    lVar4 = pa_simple_new(0,"libvgm",1,0,*(undefined8 *)((long)drvObj + 0x58),(long)drvObj + 0xc,0,0
                          ,0);
    *(long *)((long)drvObj + 0x48) = lVar4;
    if (lVar4 == 0) {
      UVar3 = 0xc0;
    }
    else {
      OSSignal_Reset(*(OS_SIGNAL **)((long)drvObj + 0x38));
      UVar3 = OSThread_Init((OS_THREAD **)((long)drvObj + 0x30),PulseThread,drvObj);
      if (UVar3 == '\0') {
        pvVar5 = malloc((ulong)*(uint *)((long)drvObj + 0x1c));
        *(void **)((long)drvObj + 0x28) = pvVar5;
        *(undefined1 *)((long)drvObj + 8) = 1;
        *(undefined1 *)((long)drvObj + 0x50) = 0;
        OSSignal_Signal(*(OS_SIGNAL **)((long)drvObj + 0x38));
        UVar3 = '\0';
      }
      else {
        pa_simple_free(*(undefined8 *)((long)drvObj + 0x48));
        UVar3 = 200;
      }
    }
  }
  return UVar3;
}

Assistant:

UINT8 Pulse_Start(void* drvObj, UINT32 deviceID, AUDIO_OPTS* options, void* audDrvParam)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	UINT64 tempInt64;
	UINT8 retVal8;
	
	if (drv->devState != 0)
		return 0xD0;	// already running
	
	drv->audDrvPtr = audDrvParam;
	if (options == NULL)
		options = &defOptions;
	drv->pulseFmt.channels = options->numChannels;
	drv->pulseFmt.rate = options->sampleRate;
	
	tempInt64 = (UINT64)options->sampleRate * options->usecPerBuf;
	drv->bufSmpls = (UINT32)((tempInt64 + 500000) / 1000000);
	drv->bufSize = (options->numBitsPerSmpl * drv->pulseFmt.channels / 8) * drv->bufSmpls;
	drv->bufCount = options->numBuffers ? options->numBuffers : 10;
	
	if (options->numBitsPerSmpl == 8)
		drv->pulseFmt.format = PA_SAMPLE_U8;
	else if (options->numBitsPerSmpl == 16)
		drv->pulseFmt.format = PA_SAMPLE_S16NE;
	else if (options->numBitsPerSmpl == 24)
		drv->pulseFmt.format = PA_SAMPLE_S24NE;
	else if (options->numBitsPerSmpl == 32)
		drv->pulseFmt.format = PA_SAMPLE_S32NE;
	else
		return 0xCF;
	
	drv->canPause = 1;
	
	drv->hPulse = pa_simple_new(NULL, "libvgm", PA_STREAM_PLAYBACK, NULL, drv->streamDesc, &drv->pulseFmt, NULL, NULL, NULL);
	if(!drv->hPulse)
		return 0xC0;
	
	OSSignal_Reset(drv->hSignal);
	retVal8 = OSThread_Init(&drv->hThread, &PulseThread, drv);
	if (retVal8)
	{
		pa_simple_free(drv->hPulse);
		return 0xC8;	// CreateThread failed
	}
	
	drv->bufSpace = (UINT8*)malloc(drv->bufSize);
	
	drv->devState = 1;
	drv->pauseThread = 0x00;
	OSSignal_Signal(drv->hSignal);
	
	return AERR_OK;
}